

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLibCore.cpp
# Opt level: O0

Variant * Jinx::Impl::AsyncCall
                    (Variant *__return_storage_ptr__,ScriptPtr *script,Parameters *params)

{
  bool bVar1;
  const_reference pvVar2;
  element_type *peVar3;
  RuntimeID functionID;
  vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> local_78;
  shared_ptr<Jinx::IScript> local_60;
  CoroutinePtr local_50;
  undefined4 local_40;
  undefined1 local_30 [8];
  ScriptIPtr s;
  Parameters *params_local;
  ScriptPtr *script_local;
  
  s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)params;
  std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>((shared_ptr<Jinx::IScript> *)local_30);
  bVar1 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::empty
                    ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                     s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
  if (bVar1) {
    peVar3 = std::__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
    Script::Error(peVar3,"\'async call\' function invoked with no parameters");
    Jinx::Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
  }
  else {
    pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                       ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                        s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,0);
    bVar1 = Jinx::Variant::IsFunction(pvVar2);
    if (bVar1) {
      std::shared_ptr<Jinx::IScript>::shared_ptr<Jinx::Impl::Script,void>
                (&local_60,(shared_ptr<Jinx::Impl::Script> *)local_30);
      pvVar2 = std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::operator[]
                         ((vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_> *)
                          s.super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi,0);
      functionID = Jinx::Variant::GetFunction(pvVar2);
      local_78.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_78.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_78.super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::vector(&local_78);
      CreateCoroutine((Jinx *)&local_50,&local_60,functionID,&local_78);
      Jinx::Variant::Variant(__return_storage_ptr__,&local_50);
      std::shared_ptr<Jinx::ICoroutine>::~shared_ptr(&local_50);
      std::vector<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>::~vector(&local_78);
      std::shared_ptr<Jinx::IScript>::~shared_ptr(&local_60);
    }
    else {
      peVar3 = std::
               __shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      Script::Error(peVar3,"\'async call\' function requires valid function variable as parameter");
      Jinx::Variant::Variant(__return_storage_ptr__,(nullptr_t)0x0);
    }
  }
  local_40 = 1;
  std::shared_ptr<Jinx::Impl::Script>::~shared_ptr((shared_ptr<Jinx::Impl::Script> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant AsyncCall(ScriptPtr script, const Parameters & params)
	{
		ScriptIPtr s = std::static_pointer_cast<Script>(script);
		if (params.empty())
		{
			s->Error("'async call' function invoked with no parameters");
			return nullptr;
		}
		if (!params[0].IsFunction())
		{
			s->Error("'async call' function requires valid function variable as parameter");
			return nullptr;
		}
		return CreateCoroutine(s, params[0].GetFunction(), Parameters());
	}